

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ulg uVar6;
  ulong uVar7;
  int iVar8;
  ushort uVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (s->last_lit == 0) {
    iVar8 = s->bi_valid;
  }
  else {
    uVar7 = 0;
    do {
      uVar3 = s->d_buf[uVar7];
      bVar1 = s->l_buf[uVar7];
      if (uVar3 == 0) {
        uVar3 = ltree[bVar1].dl.dad;
        iVar8 = s->bi_valid;
        uVar4 = ltree[bVar1].fc.freq;
        uVar11 = uVar4 << ((byte)iVar8 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar11;
        if ((int)(0x10 - (uint)uVar3) < iVar8) {
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = (Bytef)uVar11;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = BVar2;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar8 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar8 = iVar8 + (uint)uVar3;
        }
LAB_0010cf5e:
        s->bi_valid = iVar8;
      }
      else {
        uVar14 = (ulong)""[bVar1];
        uVar4 = ltree[uVar14 + 0x101].dl.dad;
        iVar8 = s->bi_valid;
        uVar11 = ltree[uVar14 + 0x101].fc.freq;
        uVar9 = uVar11 << ((byte)iVar8 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar9;
        if ((int)(0x10 - (uint)uVar4) < iVar8) {
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = (Bytef)uVar9;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = BVar2;
          uVar9 = uVar11 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar9;
          iVar8 = (uint)uVar4 + s->bi_valid + -0x10;
        }
        else {
          iVar8 = iVar8 + (uint)uVar4;
        }
        uVar10 = (uint)uVar9;
        s->bi_valid = iVar8;
        if (0xffffffffffffffeb < uVar14 - 0x1c) {
          uVar12 = (uint)bVar1 - base_length[uVar14];
          iVar5 = extra_lbits[uVar14];
          if (0x10 - iVar5 < iVar8) {
            uVar10 = uVar10 | uVar12 << ((byte)iVar8 & 0x1f);
            s->bi_buf = (ush)uVar10;
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (Bytef)uVar10;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = BVar2;
            uVar10 = (uVar12 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f);
            s->bi_buf = (ush)uVar10;
            iVar8 = s->bi_valid + iVar5 + -0x10;
          }
          else {
            uVar10 = uVar10 | uVar12 << ((byte)iVar8 & 0x1f);
            s->bi_buf = (ush)uVar10;
            iVar8 = iVar5 + iVar8;
          }
          s->bi_valid = iVar8;
        }
        uVar13 = uVar3 - 1;
        uVar12 = (uVar13 >> 7) + 0x100;
        if (uVar3 < 0x101) {
          uVar12 = uVar13;
        }
        bVar1 = ""[uVar12];
        uVar3 = dtree[bVar1].dl.dad;
        uVar4 = dtree[bVar1].fc.freq;
        uVar10 = uVar10 | (uint)uVar4 << ((byte)iVar8 & 0x1f);
        s->bi_buf = (ush)uVar10;
        if ((int)(0x10 - (uint)uVar3) < iVar8) {
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = (Bytef)uVar10;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar6 = s->pending;
          s->pending = uVar6 + 1;
          s->pending_buf[uVar6] = BVar2;
          uVar4 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar4;
          iVar8 = s->bi_valid + (uint)uVar3 + -0x10;
          uVar10 = (uint)uVar4;
        }
        else {
          iVar8 = iVar8 + (uint)uVar3;
        }
        s->bi_valid = iVar8;
        if (3 < bVar1) {
          uVar13 = uVar13 - base_dist[bVar1];
          iVar5 = extra_dbits[bVar1];
          if (0x10 - iVar5 < iVar8) {
            uVar10 = uVar10 | uVar13 << ((byte)iVar8 & 0x1f);
            s->bi_buf = (ush)uVar10;
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (Bytef)uVar10;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = BVar2;
            s->bi_buf = (ush)((uVar13 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar8 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = (ushort)uVar10 | (ushort)(uVar13 << ((byte)iVar8 & 0x1f));
            iVar8 = iVar5 + iVar8;
          }
          goto LAB_0010cf5e;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < s->last_lit);
  }
  uVar3 = ltree[0x100].dl.dad;
  uVar4 = ltree[0x100].fc.freq;
  uVar11 = uVar4 << ((byte)iVar8 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar11;
  if ((int)(0x10 - (uint)uVar3) < iVar8) {
    uVar6 = s->pending;
    s->pending = uVar6 + 1;
    s->pending_buf[uVar6] = (Bytef)uVar11;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar6 = s->pending;
    s->pending = uVar6 + 1;
    s->pending_buf[uVar6] = BVar2;
    s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar8 = (uint)uVar3 + s->bi_valid + -0x10;
  }
  else {
    iVar8 = iVar8 + (uint)uVar3;
  }
  s->bi_valid = iVar8;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    const ct_data *ltree; /* literal tree */
    const ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= (unsigned)base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
}